

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O2

int __thiscall MPEGStreamReader::readPacket(MPEGStreamReader *this,AVPacket *avPacket)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  byte bVar10;
  ulong uVar11;
  long lStack_40;
  
  avPacket->codec = (BaseAbstractStreamReader *)this;
  avPacket->flags = (this->super_AbstractStreamReader).m_flags;
  avPacket->stream_index = (this->super_AbstractStreamReader).m_streamIndex;
  iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0xd])();
  avPacket->codecID = *(int *)CONCAT44(extraout_var,iVar4);
  avPacket->duration = 0;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  lVar1 = (this->super_AbstractStreamReader).m_timeOffset;
  avPacket->pts = this->m_curPts + lVar1;
  lVar2 = this->m_curDts;
  lVar3 = this->m_pcrIncPerFrame;
  iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x17])(this);
  avPacket->dts = (lVar1 + lVar2) - iVar4 * lVar3;
  puVar8 = (this->super_AbstractStreamReader).m_curPos;
  puVar7 = (this->super_AbstractStreamReader).m_bufEnd;
  puVar6 = puVar8;
  if (this->m_syncToStream == false) {
    puVar6 = NALUnit::findNALWithStartCode(puVar8,puVar7,this->m_longCodesAllowed);
    puVar7 = (this->super_AbstractStreamReader).m_bufEnd;
    if (puVar6 == puVar7) {
      bVar10 = this->m_syncToStream;
      puVar6 = puVar7;
    }
    else {
      this->m_syncToStream = true;
      bVar10 = 1;
    }
    (this->super_AbstractStreamReader).m_curPos = puVar6;
    this->m_processedBytes = this->m_processedBytes + (long)((int)puVar6 - (int)puVar8);
    if ((bVar10 & 1) == 0) {
      return 1;
    }
  }
  puVar8 = puVar6 + 3;
  if (puVar7 < puVar6 + 3) {
    puVar8 = puVar7;
  }
  puVar7 = NALUnit::findNALWithStartCode(puVar8,puVar7,this->m_longCodesAllowed);
  puVar8 = (this->super_AbstractStreamReader).m_bufEnd;
  if (puVar7 == puVar8) {
    storeBufferRest(this);
    return 1;
  }
  uVar5 = bufFromNAL(this);
  if (uVar5 == 0) {
    uVar11 = 0;
  }
  else {
    puVar8 = (this->super_AbstractStreamReader).m_curPos;
    lVar1 = this->m_curDts;
    this->m_shortStartCodes = uVar5 < 4;
    while( true ) {
      uVar11 = (ulong)uVar5;
      iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0x1f])(this,puVar8 + uVar11);
      if (iVar4 != 5) break;
      puVar8 = NALUnit::findNALWithStartCode
                         ((this->super_AbstractStreamReader).m_curPos + uVar11,
                          (this->super_AbstractStreamReader).m_bufEnd,this->m_longCodesAllowed);
      this->m_processedBytes =
           (int64_t)(puVar8 + (this->m_processedBytes -
                              (long)(this->super_AbstractStreamReader).m_curPos));
      (this->super_AbstractStreamReader).m_curPos = puVar8;
      if (puVar8 == (this->super_AbstractStreamReader).m_bufEnd) {
        this->m_syncToStream = false;
        goto LAB_001c7c4b;
      }
      uVar5 = bufFromNAL(this);
      puVar6 = puVar8;
    }
    if (iVar4 == -10) {
LAB_001c7c4b:
      storeBufferRest(this);
      this->m_lastDecodedPos = (uint8_t *)0x0;
      return 1;
    }
    lVar2 = this->m_curDts;
    if (lVar1 != lVar2) {
      lVar1 = (this->super_AbstractStreamReader).m_timeOffset;
      avPacket->pts = this->m_curPts + lVar1;
      lVar3 = this->m_pcrIncPerFrame;
      iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0x17])(this);
      avPacket->dts = (lVar2 + lVar1) - iVar4 * lVar3;
      iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0x1c])(this);
      if ((char)iVar4 != '\0') {
        *(byte *)&avPacket->flags = (byte)avPacket->flags | 8;
      }
      iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0x11])(this,avPacket);
      if ((char)iVar4 != '\0') {
        *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x10;
      }
      if (this->m_spsPpsFound != true) {
        return 0;
      }
      *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x20;
      return 0;
    }
    puVar8 = (this->super_AbstractStreamReader).m_bufEnd;
  }
  puVar9 = (this->super_AbstractStreamReader).m_curPos;
  puVar7 = puVar9 + 0x8000;
  if (puVar7 < puVar8) {
    puVar8 = puVar7;
  }
  puVar9 = NALUnit::findNALWithStartCode(puVar9 + uVar11,puVar8,this->m_longCodesAllowed);
  puVar7 = puVar9;
  if (puVar9 == puVar8) {
    if (*puVar9 == '\0') {
      if (puVar9[-1] != '\0') goto LAB_001c7bb0;
      puVar8 = puVar9 + -1;
      lStack_40 = -2;
    }
    else {
      if (((*puVar9 != '\x01') || (puVar9[-1] != '\0')) || (puVar9[-2] != '\0')) goto LAB_001c7bb0;
      puVar8 = puVar9 + -2;
      lStack_40 = -3;
    }
    puVar7 = puVar9 + lStack_40;
    if (puVar9[lStack_40] != '\0') {
      puVar7 = puVar8;
    }
  }
LAB_001c7bb0:
  avPacket->data = (this->super_AbstractStreamReader).m_curPos;
  avPacket->size = (int)puVar7 - (int)puVar6;
  lVar1 = (this->super_AbstractStreamReader).m_timeOffset;
  avPacket->pts = this->m_curPts + lVar1;
  lVar2 = this->m_curDts;
  lVar3 = this->m_pcrIncPerFrame;
  iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x17])(this);
  avPacket->dts = (lVar1 + lVar2) - iVar4 * lVar3;
  iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x1c])(this);
  if ((char)iVar4 != '\0') {
    *(byte *)&avPacket->flags = (byte)avPacket->flags | 8;
  }
  iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x11])(this,avPacket);
  if ((char)iVar4 != '\0') {
    *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x10;
  }
  if (this->m_spsPpsFound == true) {
    *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x20;
  }
  (this->super_AbstractStreamReader).m_curPos = puVar7;
  (this->super_AbstractStreamReader).m_tmpBufferLen = 0;
  this->m_processedBytes = this->m_processedBytes + (long)avPacket->size;
  return 0;
}

Assistant:

int MPEGStreamReader::readPacket(AVPacket& avPacket)
{
    // LTRACE(LT_DEBUG, 0, "MPEGStreamReader::readPacket");
    avPacket.codec = this;
    avPacket.flags = m_flags;
    avPacket.stream_index = m_streamIndex;
    avPacket.codecID = getCodecInfo().codecID;

    avPacket.duration = 0;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.pts = m_curPts + m_timeOffset;
    avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back
    const uint8_t* prevPos = m_curPos;
    if (!m_syncToStream)
    {
        uint8_t* nal = NALUnit::findNALWithStartCode(m_curPos, m_bufEnd, m_longCodesAllowed);
        if (nal != m_bufEnd)
        {
            m_syncToStream = true;
            m_curPos = nal;
        }
        else
            m_curPos = m_bufEnd;
        const int bytesProcessed = static_cast<int>(m_curPos - prevPos);
        m_processedBytes += bytesProcessed;
        prevPos = m_curPos;
        if (!m_syncToStream)
            return NEED_MORE_DATA;
    }

    const uint8_t* nextNal =
        NALUnit::findNALWithStartCode((std::min)(m_curPos + 3, m_bufEnd), m_bufEnd, m_longCodesAllowed);
    if (nextNal == m_bufEnd)
    {
        storeBufferRest();
        return NEED_MORE_DATA;
    }

    int isNal = bufFromNAL();
    if (isNal)
    {
        const int64_t prevDts = m_curDts;
        m_shortStartCodes = isNal < 4;
        int rez;
        while (true)
        {
            rez = decodeNal(m_curPos + isNal);
            if (rez != UNIT_SKIPPED)
                break;
            uint8_t* nal = NALUnit::findNALWithStartCode(m_curPos + isNal, m_bufEnd, m_longCodesAllowed);
            // assert(nal < findEnd); // if unit is skipped, next unit MUST be in buffer

            m_processedBytes += nal - m_curPos;
            prevPos = m_curPos = nal;
            if (nal == m_bufEnd)
            {
                rez = NOT_ENOUGH_BUFFER;
                m_syncToStream = false;
                break;
            }
            isNal = bufFromNAL();
        }

        if (rez == NOT_ENOUGH_BUFFER)
        {
            storeBufferRest();
            m_lastDecodedPos = nullptr;
            return NEED_MORE_DATA;
        }
        if (prevDts != m_curDts)
        {
            // stream interleaving is allowed during one stream packet

            avPacket.pts = m_curPts + m_timeOffset;
            avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back to 1 frame;
            if (isIFrame())
                avPacket.flags |= AVPacket::IS_IFRAME;
            if (isPriorityData(&avPacket))
                avPacket.flags |= AVPacket::PRIORITY_DATA;
            if (m_spsPpsFound)
                avPacket.flags |= AVPacket::IS_SPS_PPS_IN_GOP;

            return 0;  // return zero AV packet for new frame
        }
    }
    uint8_t* findEnd = (std::min)(m_bufEnd, m_curPos + MAX_AV_PACKET_SIZE);
    uint8_t* nal = NALUnit::findNALWithStartCode(m_curPos + isNal, findEnd, m_longCodesAllowed);

    if (nal == findEnd)
    {
        if (nal[0] == 1 && nal[-1] == 0 && nal[-2] == 0)
        {
            nal -= 2;
            if (nal[-1] == 0)
                nal--;
        }
        else if (nal[0] == 0 && nal[-1] == 0)
        {
            nal--;
            if (nal[-1] == 0)
                nal--;
        }
    }

    const int bytesProcessed = static_cast<int>(nal - prevPos);
    avPacket.data = m_curPos;
    avPacket.size = bytesProcessed;
    avPacket.pts = m_curPts + m_timeOffset;
    avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back
    if (isIFrame())
        avPacket.flags |= AVPacket::IS_IFRAME;
    if (isPriorityData(&avPacket))
        avPacket.flags |= AVPacket::PRIORITY_DATA;
    if (m_spsPpsFound)
        avPacket.flags |= AVPacket::IS_SPS_PPS_IN_GOP;

    m_curPos = nal;

    m_tmpBufferLen = 0;
    m_processedBytes += avPacket.size;

    return 0;
}